

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-quest.c
# Opt level: O0

wchar_t quests_count(void)

{
  wchar_t local_14;
  quest *pqStack_10;
  wchar_t num;
  quest *quest;
  
  local_14 = L'\0';
  for (pqStack_10 = quests; pqStack_10 != (quest *)0x0; pqStack_10 = pqStack_10->next) {
    if ((pqStack_10->complete & 1U) != 0) {
      local_14 = local_14 + L'\x01';
    }
  }
  return local_14;
}

Assistant:

int quests_count(void)
{
	struct quest *quest = quests;
	int num = 0;
	while (quest) {
		if (quest->complete) {
			num++;
		}
		quest = quest->next;
	}
	return num;
}